

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StressTest.cpp
# Opt level: O0

void __thiscall StressTester::CreateTreeHelper(StressTester *this,TestObject *root,int depth)

{
  Recycler *pRVar1;
  int iVar2;
  TestObject *pTVar3;
  size_t extraBytes;
  TestObject *newObj;
  int i;
  int depth_local;
  TestObject *root_local;
  StressTester *this_local;
  
  newObj._0_4_ = 0;
  while ((int)newObj < root->pointerCount) {
    if ((depth == 0) || (1000 < this->treeTotal)) {
      pRVar1 = this->recycler;
      iVar2 = PAL_rand();
      pTVar3 = TestObject::Create(pRVar1,0,(long)iVar2,LeafObj);
      TestObject::Add(root,pTVar3);
    }
    else {
      pRVar1 = this->recycler;
      extraBytes = GetRandomSize(this);
      pTVar3 = TestObject::Create(pRVar1,4,extraBytes,NormalObj);
      CreateTreeHelper(this,pTVar3,depth + -1);
      TestObject::Add(root,pTVar3);
    }
    newObj._0_4_ = (int)newObj + 1;
    this->treeTotal = this->treeTotal + 1;
  }
  return;
}

Assistant:

void StressTester::CreateTreeHelper(TestObject *root, int depth) {
    for (int i = 0; i < root->pointerCount; ++i, ++treeTotal)
    {
        if (depth == 0 || treeTotal > MaxNodesInTree)
        {
            root->Add(TestObject::Create(recycler, 0, rand(), LeafObj));
        }
        else
        {
            TestObject *newObj = TestObject::Create(recycler, 4, GetRandomSize());
            CreateTreeHelper(newObj, depth - 1);
            root->Add(newObj);
        }
    }
}